

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void __thiscall
wallet::coinselector_tests::knapsack_solver_test::test_method(knapsack_solver_test *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  double dVar3;
  char *in_stack_ffffffffffffbb58;
  CFeeRate *pCVar4;
  FastRandomContext *this_00;
  CoinsResult *in_stack_ffffffffffffbb60;
  ulong uVar5;
  lazy_ostream *plVar6;
  char *in_stack_ffffffffffffbb68;
  assertion_result *paVar7;
  char *pcVar8;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *puVar9;
  char *pcVar10;
  anon_class_8_1_8990f923 *in_stack_ffffffffffffbb70;
  SelectionResult *in_stack_ffffffffffffbb78;
  undefined7 in_stack_ffffffffffffbb80;
  undefined1 in_stack_ffffffffffffbb87;
  lazy_ostream *in_stack_ffffffffffffbb88;
  SelectionResult *in_stack_ffffffffffffbb90;
  SelectionResult *in_stack_ffffffffffffbb98;
  undefined6 in_stack_ffffffffffffbba0;
  undefined1 in_stack_ffffffffffffbba6;
  undefined1 in_stack_ffffffffffffbba7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffbba8;
  undefined7 in_stack_ffffffffffffbbc0;
  undefined1 in_stack_ffffffffffffbbc7;
  NodeContext *in_stack_ffffffffffffbbc8;
  CoinEligibilityFilter *in_stack_ffffffffffffbbd0;
  CWallet *in_stack_ffffffffffffbbd8;
  CoinsResult *in_stack_ffffffffffffbbe0;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *in_stack_ffffffffffffbc40;
  undefined7 in_stack_ffffffffffffbc48;
  undefined1 in_stack_ffffffffffffbc4f;
  CWallet *in_stack_ffffffffffffbc50;
  SelectionResult *in_stack_ffffffffffffbc58;
  CFeeRate in_stack_ffffffffffffbce0;
  int iVar11;
  type in_stack_ffffffffffffbed0;
  int iVar12;
  type in_stack_ffffffffffffbee0;
  int j_3;
  int i_3;
  int j_2;
  int i_2;
  int i2;
  int i_1;
  uint16_t j_1;
  int j;
  int i;
  knapsack_solver_test *this_local;
  lazy_ostream local_37a4;
  undefined1 local_3790 [64];
  const_string local_3750 [2];
  lazy_ostream local_3730 [2];
  assertion_result local_3710 [2];
  undefined8 local_36d8;
  const_string local_36b8 [2];
  lazy_ostream local_3698 [2];
  assertion_result local_3678 [2];
  undefined8 local_3640;
  int fails_1;
  undefined8 local_3610;
  undefined8 local_3600;
  undefined8 local_35f0;
  undefined8 local_35e0;
  code *local_35d0;
  CoinsResult local_35c4;
  const_string local_3570 [2];
  lazy_ostream local_3550 [2];
  assertion_result local_3530 [3];
  const_string local_34e0 [2];
  lazy_ostream local_34c0 [2];
  assertion_result local_34a0 [3];
  int fails;
  const_string local_3448 [2];
  lazy_ostream local_3428 [2];
  assertion_result local_3408 [2];
  const_string local_33d0 [2];
  lazy_ostream local_33b0 [2];
  assertion_result local_3390 [2];
  undefined8 local_3358;
  const_string local_3338 [2];
  lazy_ostream local_3318 [2];
  assertion_result local_32f8 [2];
  undefined8 local_32c0;
  CoinsResult local_3294;
  CAmount local_3238;
  undefined1 local_3230 [16];
  undefined1 local_3220 [64];
  size_type local_31e0;
  undefined1 local_31d8 [16];
  undefined1 local_31c8 [64];
  CAmount local_3188;
  undefined1 local_3180 [16];
  undefined1 local_3170 [64];
  CAmount returnValue;
  uint16_t returnSize;
  const_string local_3120 [2];
  lazy_ostream local_3100 [2];
  assertion_result local_30e0 [2];
  undefined8 local_30a8;
  CAmount amt;
  undefined1 local_308c [12];
  undefined1 local_3080 [16];
  undefined1 local_3070 [64];
  CoinsResult local_3030;
  const_string local_2fd0 [2];
  lazy_ostream local_2fb0 [2];
  assertion_result local_2f90 [2];
  undefined8 local_2f58;
  CoinsResult local_2f4c;
  CoinsResult local_2ef0;
  const_string local_2e90 [2];
  lazy_ostream local_2e70 [2];
  assertion_result local_2e50 [2];
  undefined8 local_2e18;
  undefined8 local_2e08;
  undefined8 local_2df8;
  undefined8 local_2de8;
  lazy_ostream local_2ddc;
  undefined1 local_2dc0 [64];
  CAmount local_2d80;
  undefined1 local_2d78 [16];
  undefined1 local_2d68 [64];
  const_string local_2d28 [2];
  lazy_ostream local_2d08 [2];
  assertion_result local_2ce8 [2];
  undefined8 local_2ca8;
  undefined8 local_2c98;
  undefined8 local_2c88;
  undefined8 local_2c78;
  lazy_ostream local_2c6c;
  undefined1 local_2c50 [64];
  lazy_ostream local_2c10;
  undefined1 local_2c00 [16];
  undefined1 local_2bf0 [64];
  const_string local_2bb0 [2];
  lazy_ostream local_2b90 [2];
  assertion_result local_2b70 [2];
  undefined8 local_2b38;
  undefined8 local_2b28;
  undefined8 local_2b18;
  undefined8 local_2b08;
  undefined8 local_2af8;
  lazy_ostream local_2aec;
  undefined1 local_2ad0 [64];
  lazy_ostream local_2a90;
  undefined1 local_2a80 [16];
  undefined1 local_2a70 [64];
  const_string local_2a30 [2];
  lazy_ostream local_2a10 [2];
  assertion_result local_29f0 [2];
  undefined8 local_29b8;
  undefined8 local_29a8;
  lazy_ostream local_29a0;
  undefined1 local_2990 [16];
  undefined1 local_2980 [64];
  const_string local_2940 [2];
  lazy_ostream local_2920 [2];
  assertion_result local_2900 [2];
  undefined8 local_28c8;
  undefined8 local_28b8;
  undefined8 local_28a8;
  lazy_ostream local_28a0;
  undefined1 local_2890 [16];
  undefined1 local_2880 [64];
  const_string local_2840 [2];
  lazy_ostream local_2820 [2];
  assertion_result local_2800 [2];
  undefined8 local_27c8;
  undefined8 local_27b8;
  CAmount local_27b0;
  undefined1 local_27a8 [16];
  undefined1 local_2798 [64];
  const_string local_2758 [2];
  lazy_ostream local_2738 [2];
  assertion_result local_2718 [2];
  undefined8 local_26d8;
  undefined8 local_26c8;
  undefined8 local_26b8;
  undefined8 local_26a8;
  undefined8 local_2698;
  lazy_ostream local_268c;
  undefined1 local_2670 [64];
  lazy_ostream local_2630;
  undefined1 local_2620 [16];
  undefined1 local_2610 [64];
  const_string local_25d0 [2];
  lazy_ostream local_25b0 [2];
  assertion_result local_2590 [2];
  undefined8 local_2558;
  lazy_ostream local_254c;
  undefined1 local_2530 [64];
  lazy_ostream local_24f0;
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [64];
  const_string local_2490 [2];
  lazy_ostream local_2470 [2];
  assertion_result local_2450 [2];
  undefined8 local_2418;
  undefined8 local_2408;
  undefined8 local_23f8;
  undefined8 local_23e8;
  undefined8 local_23d8;
  lazy_ostream local_23cc;
  undefined1 local_23b0 [64];
  lazy_ostream local_2370;
  undefined1 local_2360 [16];
  undefined1 local_2350 [64];
  const_string local_2310 [2];
  lazy_ostream local_22f0 [2];
  assertion_result local_22d0 [2];
  undefined8 local_2298;
  lazy_ostream local_228c;
  undefined1 local_2270 [64];
  lazy_ostream local_2230;
  undefined1 local_2220 [16];
  undefined1 local_2210 [64];
  const_string local_21d0 [2];
  lazy_ostream local_21b0 [2];
  assertion_result local_2190 [2];
  undefined8 local_2158;
  undefined8 local_2148;
  lazy_ostream local_213c;
  undefined1 local_2120 [64];
  lazy_ostream local_20e0;
  undefined1 local_20d0 [16];
  undefined1 local_20c0 [64];
  const_string local_2080 [2];
  lazy_ostream local_2060 [2];
  assertion_result local_2040 [2];
  undefined8 local_2008;
  undefined8 local_2000;
  code *local_1ff8;
  lazy_ostream local_1fec;
  undefined1 local_1fd0 [64];
  lazy_ostream local_1f90;
  undefined1 local_1f80 [16];
  undefined1 local_1f70 [64];
  const_string local_1f30 [2];
  lazy_ostream local_1f10 [2];
  assertion_result local_1ef0 [2];
  undefined8 local_1eb8;
  const_string local_1eb0 [2];
  lazy_ostream local_1e90 [2];
  undefined8 local_1e70;
  assertion_result local_1e68 [2];
  const_string local_1e30 [2];
  lazy_ostream local_1e10 [2];
  assertion_result local_1df0 [2];
  undefined8 local_1db8;
  char *local_1da8;
  undefined8 local_1d98;
  undefined8 local_1d88;
  undefined1 *local_1d78;
  undefined8 local_1d68;
  lazy_ostream local_1d5c;
  undefined1 local_1d40 [64];
  lazy_ostream local_1d00;
  undefined1 local_1cf0 [16];
  undefined1 local_1ce0 [64];
  const_string local_1ca0 [2];
  lazy_ostream local_1c80 [2];
  assertion_result local_1c60 [2];
  undefined8 local_1c28;
  lazy_ostream local_1c1c;
  undefined1 local_1c00 [64];
  const_string local_1bc0 [2];
  lazy_ostream local_1ba0 [2];
  assertion_result local_1b80 [2];
  const_string local_1b48 [2];
  lazy_ostream local_1b28 [2];
  assertion_result local_1b08 [2];
  undefined8 local_1ad0;
  lazy_ostream local_1ac4;
  undefined1 local_1aa8 [64];
  lazy_ostream local_1a68;
  undefined1 local_1a58 [16];
  undefined1 local_1a48 [64];
  const_string local_1a08 [2];
  lazy_ostream local_19e8 [2];
  assertion_result local_19c8 [2];
  undefined1 *local_1990;
  lazy_ostream local_1984;
  undefined1 local_1968 [64];
  lazy_ostream local_1928;
  undefined1 local_1918 [16];
  undefined1 local_1908 [64];
  const_string local_18c8 [2];
  lazy_ostream local_18a8 [2];
  assertion_result local_1888 [2];
  dword *local_1850;
  lazy_ostream local_1848;
  undefined1 local_1838 [16];
  undefined1 local_1828 [64];
  const_string local_17e8 [2];
  lazy_ostream local_17c8 [2];
  assertion_result local_17a8 [2];
  undefined8 local_1770;
  lazy_ostream local_1768;
  undefined1 local_1758 [16];
  undefined1 local_1748 [64];
  const_string local_1708 [2];
  lazy_ostream local_16e8 [2];
  assertion_result local_16c8 [2];
  uleb128 *local_1690;
  const_string local_1688 [2];
  lazy_ostream local_1668 [2];
  undefined8 local_1648;
  assertion_result local_1640 [2];
  const_string local_1608 [2];
  lazy_ostream local_15e8 [2];
  undefined8 local_15c8;
  assertion_result local_15c0 [2];
  undefined8 local_1580;
  undefined8 local_1570;
  code *local_1560;
  lazy_ostream local_1558;
  undefined1 local_1548 [16];
  undefined1 local_1538 [64];
  const_string local_14f8 [2];
  lazy_ostream local_14d8 [2];
  assertion_result local_14b8 [2];
  undefined8 local_1480;
  const_string local_1478 [2];
  lazy_ostream local_1458 [2];
  undefined8 local_1438;
  assertion_result local_1430 [2];
  undefined8 local_13f0;
  lazy_ostream local_13e8;
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [64];
  const_string local_1388 [2];
  lazy_ostream local_1368 [2];
  assertion_result local_1348 [2];
  undefined8 local_1310;
  const_string local_1308 [2];
  lazy_ostream local_12e8 [2];
  undefined8 local_12c8;
  assertion_result local_12c0 [2];
  undefined8 local_1280;
  const_string local_1278 [2];
  lazy_ostream local_1258 [2];
  undefined8 local_1238;
  assertion_result local_1230 [2];
  allocator<char> local_11f1;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> wallet;
  anon_class_8_1_8990f923 KnapsackSolver;
  anon_class_8_1_8990f923 temp1;
  optional<wallet::SelectionResult> result30;
  optional<wallet::SelectionResult> result29;
  optional<wallet::SelectionResult> result28;
  optional<wallet::SelectionResult> result27;
  optional<wallet::SelectionResult> result26;
  optional<wallet::SelectionResult> result25;
  optional<wallet::SelectionResult> result24;
  optional<wallet::SelectionResult> result23;
  optional<wallet::SelectionResult> result22;
  optional<wallet::SelectionResult> result21;
  optional<wallet::SelectionResult> result20;
  optional<wallet::SelectionResult> result19;
  optional<wallet::SelectionResult> result18;
  optional<wallet::SelectionResult> result17;
  optional<wallet::SelectionResult> result16;
  optional<wallet::SelectionResult> result15;
  optional<wallet::SelectionResult> result14;
  optional<wallet::SelectionResult> result13;
  optional<wallet::SelectionResult> result12;
  optional<wallet::SelectionResult> result11;
  optional<wallet::SelectionResult> result10;
  optional<wallet::SelectionResult> result9;
  optional<wallet::SelectionResult> result8;
  optional<wallet::SelectionResult> result7;
  optional<wallet::SelectionResult> result6;
  optional<wallet::SelectionResult> result5;
  optional<wallet::SelectionResult> result4;
  optional<wallet::SelectionResult> result3;
  optional<wallet::SelectionResult> result2;
  optional<wallet::SelectionResult> result1;
  CoinsResult available_coins;
  FastRandomContext rand;
  
  local_2000 = 0;
  local_3030.total_amount = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)in_stack_ffffffffffffbb68,
             SUB81((ulong)in_stack_ffffffffffffbb60 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffbba8,
             (char *)CONCAT17(in_stack_ffffffffffffbba7,
                              CONCAT16(in_stack_ffffffffffffbba6,in_stack_ffffffffffffbba0)),
             (allocator<char> *)in_stack_ffffffffffffbb98);
  NewWallet(in_stack_ffffffffffffbbc8,
            (string *)CONCAT17(in_stack_ffffffffffffbbc7,in_stack_ffffffffffffbbc0));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffbb58);
  std::allocator<char>::~allocator(&local_11f1);
  CoinsResult::CoinsResult(in_stack_ffffffffffffbb60);
  for (i = 0; i < 100; i = i + 1) {
    CoinsResult::Clear((CoinsResult *)in_stack_ffffffffffffbb58);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
                 in_stack_ffffffffffffbb68);
      KnapsackGroupOutputs
                (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
      local_1238 = 1000000;
      test_method::anon_class_8_1_8990f923::operator()
                (in_stack_ffffffffffffbb70,
                 (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                 in_stack_ffffffffffffbb68,(CAmount *)in_stack_ffffffffffffbb60,
                 (CAmount)in_stack_ffffffffffffbb58);
      std::optional::operator_cast_to_bool
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbb68,
                 SUB81((ulong)in_stack_ffffffffffffbb60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbb60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      in_stack_ffffffffffffbb58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1230,local_1258,local_1278,0x1ff,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbb58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbb58);
      std::optional<wallet::SelectionResult>::~optional
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
               in_stack_ffffffffffffbb68);
    local_1280 = 1000000;
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbb58,0);
    paVar7 = (assertion_result *)((ulong)in_stack_ffffffffffffbb68 & 0xffffffff00000000);
    plVar6 = (lazy_ostream *)((ulong)in_stack_ffffffffffffbb60 & 0xffffffff00000000);
    in_stack_ffffffffffffbb58 = (char *)((ulong)in_stack_ffffffffffffbb58 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)paVar7);
      KnapsackGroupOutputs
                (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
      local_12c8 = 1000000;
      test_method::anon_class_8_1_8990f923::operator()
                (in_stack_ffffffffffffbb70,
                 (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)paVar7,
                 (CAmount *)plVar6,(CAmount)in_stack_ffffffffffffbb58);
      std::optional::operator_cast_to_bool
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      boost::test_tools::assertion_result::assertion_result(paVar7,SUB81((ulong)plVar6 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      in_stack_ffffffffffffbb58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_12c0,local_12e8,local_1308,0x204,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbb58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbb58);
      std::optional<wallet::SelectionResult>::~optional
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)paVar7);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_1310 = 1000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)paVar7,
               (CAmount *)plVar6,(CAmount)in_stack_ffffffffffffbb58);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                (paVar7,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      in_stack_ffffffffffffbb58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1348,local_1368,local_1388,0x208,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbb58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      local_13e8._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_13e8._vptr_lazy_ostream = (_func_int **)0xf4240;
      paVar7 = (assertion_result *)0x1cdf734;
      plVar6 = &local_13e8;
      in_stack_ffffffffffffbb58 = "result1->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_13c8,local_13d8,0x209,1,2,&local_13e8.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)paVar7);
    local_13f0 = 2000000;
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbb58,0);
    pcVar8 = (char *)((ulong)paVar7 & 0xffffffff00000000);
    plVar6 = (lazy_ostream *)((ulong)plVar6 & 0xffffffff00000000);
    in_stack_ffffffffffffbb58 = (char *)((ulong)in_stack_ffffffffffffbb58 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar8);
      KnapsackGroupOutputs
                (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
      local_1438 = 3000000;
      test_method::anon_class_8_1_8990f923::operator()
                (in_stack_ffffffffffffbb70,
                 (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar8,
                 (CAmount *)plVar6,(CAmount)in_stack_ffffffffffffbb58);
      std::optional::operator_cast_to_bool
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar8,SUB81((ulong)plVar6 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      in_stack_ffffffffffffbb58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1430,local_1458,local_1478,0x20e,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbb58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbb58);
      std::optional<wallet::SelectionResult>::~optional
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar8);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_1480 = 3000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar8,
               (CAmount *)plVar6,(CAmount)in_stack_ffffffffffffbb58);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar8,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      in_stack_ffffffffffffbb58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_14b8,local_14d8,local_14f8,0x212,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbb58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar8,(pointer)plVar6,
                 (unsigned_long)in_stack_ffffffffffffbb58);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      local_1558._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_1558._vptr_lazy_ostream = (_func_int **)0x2dc6c0;
      pcVar8 = "3 * CENT";
      plVar6 = &local_1558;
      in_stack_ffffffffffffbb58 = "result2->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_1538,local_1548,0x213,1,2,&local_1558.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar8);
    local_1560 = std::__atomic_base<unsigned_long>::operator=;
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbb58,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)pcVar8 & 0xffffffff00000000);
    uVar5 = (ulong)plVar6 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)in_stack_ffffffffffffbb58 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_1570 = 10000000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_1580 = 20000000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    pcVar10 = (char *)((ulong)puVar9 & 0xffffffff00000000);
    plVar6 = (lazy_ostream *)(uVar5 & 0xffffffff00000000);
    pcVar8 = (char *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
      KnapsackGroupOutputs
                (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
      local_15c8 = 38000000;
      test_method::anon_class_8_1_8990f923::operator()
                (in_stack_ffffffffffffbb70,
                 (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
                 (CAmount *)plVar6,(CAmount)pcVar8);
      std::optional::operator_cast_to_bool((optional<wallet::SelectionResult> *)pcVar8);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar10,SUB81((ulong)plVar6 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_15c0,local_15e8,local_1608,0x21c,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      std::optional<wallet::SelectionResult>::~optional((optional<wallet::SelectionResult> *)pcVar8)
      ;
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
      KnapsackGroupOutputs
                (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
      local_1648 = 38000000;
      test_method::anon_class_8_1_8990f923::operator()
                (in_stack_ffffffffffffbb70,
                 (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
                 (CAmount *)plVar6,(CAmount)pcVar8);
      std::optional::operator_cast_to_bool((optional<wallet::SelectionResult> *)pcVar8);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar10,SUB81((ulong)plVar6 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1640,local_1668,local_1688,0x21e,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      std::optional<wallet::SelectionResult>::~optional((optional<wallet::SelectionResult> *)pcVar8)
      ;
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_1690 = &uleb128_02349340;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_16c8,local_16e8,local_1708,0x221,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_1768._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_1768._vptr_lazy_ostream = (_func_int **)&uleb128_02349340;
      pcVar10 = "37 * CENT";
      plVar6 = &local_1768;
      pcVar8 = "result3->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_1748,local_1758,0x222,1,2,&local_1768.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_1770 = 38000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_17a8,local_17c8,local_17e8,0x225,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_1848._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_1848._vptr_lazy_ostream = (_func_int **)0x243d580;
      pcVar10 = "38 * CENT";
      plVar6 = &local_1848;
      pcVar8 = "result4->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_1828,local_1838,0x226,1,2,&local_1848.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_1850 = &DWORD_0206cc80;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1888,local_18a8,local_18c8,0x22a,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_1928._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_1928._vptr_lazy_ostream = (_func_int **)&DWORD_02160ec0;
      pcVar10 = "35 * CENT";
      plVar6 = &local_1928;
      pcVar8 = "result5->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_1908,local_1918,0x22b,1,2,&local_1928.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetInputSet((SelectionResult *)pcVar8);
      local_1984._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)pcVar8);
      local_1984._vptr_lazy_ostream._0_4_ = 3;
      pcVar10 = "3U";
      plVar6 = &local_1984;
      pcVar8 = "result5->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_1968,&local_1984.field_0xc,0x22c,1,2,
                 (undefined1 *)((long)&local_1984._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_1990 = &LAB_006acfc0;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_19c8,local_19e8,local_1a08,0x230,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_1a68._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_1a68._vptr_lazy_ostream = (_func_int **)&LAB_006acfc0;
      pcVar10 = "7 * CENT";
      plVar6 = &local_1a68;
      pcVar8 = "result6->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_1a48,local_1a58,0x231,1,2,&local_1a68.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetInputSet((SelectionResult *)pcVar8);
      local_1ac4._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)pcVar8);
      local_1ac4._vptr_lazy_ostream._0_4_ = 2;
      pcVar10 = "2U";
      plVar6 = &local_1ac4;
      pcVar8 = "result6->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_1aa8,&local_1ac4.field_0xc,0x232,1,2,
                 (undefined1 *)((long)&local_1ac4._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_1ad0 = 8000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1b08,local_1b28,local_1b48,0x236,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar10,SUB81((ulong)plVar6 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1b80,local_1ba0,local_1bc0,0x237,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetInputSet((SelectionResult *)pcVar8);
      local_1c1c._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)pcVar8);
      local_1c1c._vptr_lazy_ostream._0_4_ = 3;
      pcVar10 = "3U";
      plVar6 = &local_1c1c;
      pcVar8 = "result7->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_1c00,&local_1c1c.field_0xc,0x238,1,2,
                 (undefined1 *)((long)&local_1c1c._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_1c28 = 9000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1c60,local_1c80,local_1ca0,0x23c,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_1d00._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_1d00._vptr_lazy_ostream = (_func_int **)0x989680;
      pcVar10 = "10 * CENT";
      plVar6 = &local_1d00;
      pcVar8 = "result8->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_1ce0,local_1cf0,0x23d,1,2,&local_1d00.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetInputSet((SelectionResult *)pcVar8);
      local_1d5c._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)pcVar8);
      local_1d5c._vptr_lazy_ostream._0_4_ = 1;
      pcVar10 = "1U";
      plVar6 = &local_1d5c;
      pcVar8 = "result8->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_1d40,&local_1d5c.field_0xc,0x23e,1,2,
                 (undefined1 *)((long)&local_1d5c._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    CoinsResult::Clear((CoinsResult *)pcVar8);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    local_1d68 = 6000000;
    CFeeRate::CFeeRate<int>((CFeeRate *)pcVar8,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)pcVar10 & 0xffffffff00000000);
    uVar5 = (ulong)plVar6 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pcVar8 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_1d78 = &LAB_006acfc0;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_1d88 = 8000000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_1d98 = 20000000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_1da8 = "tToArith256(vBlocksMain[i].GetBlockHash()).GetLow64()";
    CFeeRate::CFeeRate<int>(pCVar4,0);
    pcVar10 = (char *)((ulong)puVar9 & 0xffffffff00000000);
    plVar6 = (lazy_ostream *)(uVar5 & 0xffffffff00000000);
    pcVar8 = (char *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_1db8 = 71000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1df0,local_1e10,local_1e30,0x24b,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
      KnapsackGroupOutputs
                (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
      local_1e70 = 72000000;
      test_method::anon_class_8_1_8990f923::operator()
                (in_stack_ffffffffffffbb70,
                 (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
                 (CAmount *)plVar6,(CAmount)pcVar8);
      std::optional::operator_cast_to_bool((optional<wallet::SelectionResult> *)pcVar8);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)pcVar10,SUB81((ulong)plVar6 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1e68,local_1e90,local_1eb0,0x24c,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      std::optional<wallet::SelectionResult>::~optional((optional<wallet::SelectionResult> *)pcVar8)
      ;
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_1eb8 = 16000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1ef0,local_1f10,local_1f30,0x250,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_1f90._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_1f90._vptr_lazy_ostream = (_func_int **)0x1312d00;
      pcVar10 = "20 * CENT";
      plVar6 = &local_1f90;
      pcVar8 = "result10->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_1f70,local_1f80,0x251,1,2,&local_1f90.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetInputSet((SelectionResult *)pcVar8);
      local_1fec._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)pcVar8);
      local_1fec._vptr_lazy_ostream._0_4_ = 1;
      pcVar10 = "1U";
      plVar6 = &local_1fec;
      pcVar8 = "result10->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_1fd0,&local_1fec.field_0xc,0x252,1,2,
                 (undefined1 *)((long)&local_1fec._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    local_1ff8 = std::__atomic_base<unsigned_long>::operator=;
    CFeeRate::CFeeRate<int>((CFeeRate *)pcVar8,0);
    pcVar10 = (char *)((ulong)pcVar10 & 0xffffffff00000000);
    plVar6 = (lazy_ostream *)((ulong)plVar6 & 0xffffffff00000000);
    pcVar8 = (char *)((ulong)pcVar8 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_2008 = 16000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2040,local_2060,local_2080,600,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_20e0._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_20e0._vptr_lazy_ostream = (_func_int **)0x112a880;
      pcVar10 = "18 * CENT";
      plVar6 = &local_20e0;
      pcVar8 = "result11->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_20c0,local_20d0,0x259,1,2,&local_20e0.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetInputSet((SelectionResult *)pcVar8);
      local_213c._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)pcVar8);
      local_213c._vptr_lazy_ostream._0_4_ = 3;
      pcVar10 = "3U";
      plVar6 = &local_213c;
      pcVar8 = "result11->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_2120,&local_213c.field_0xc,0x25a,1,2,
                 (undefined1 *)((long)&local_213c._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    local_2148 = 18000000;
    CFeeRate::CFeeRate<int>((CFeeRate *)pcVar8,0);
    pcVar10 = (char *)((ulong)pcVar10 & 0xffffffff00000000);
    plVar6 = (lazy_ostream *)((ulong)plVar6 & 0xffffffff00000000);
    pcVar8 = (char *)((ulong)pcVar8 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_2158 = 16000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2190,local_21b0,local_21d0,0x260,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_2230._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_2230._vptr_lazy_ostream = (_func_int **)0x112a880;
      pcVar10 = "18 * CENT";
      plVar6 = &local_2230;
      pcVar8 = "result12->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_2210,local_2220,0x261,1,2,&local_2230.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetInputSet((SelectionResult *)pcVar8);
      local_228c._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)pcVar8);
      local_228c._vptr_lazy_ostream._0_4_ = 1;
      pcVar10 = "1U";
      plVar6 = &local_228c;
      pcVar8 = "result12->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_2270,&local_228c.field_0xc,0x262,1,2,
                 (undefined1 *)((long)&local_228c._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_2298 = 11000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_22d0,local_22f0,local_2310,0x266,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_2370._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_2370._vptr_lazy_ostream = (_func_int **)0xa7d8c0;
      pcVar10 = "11 * CENT";
      plVar6 = &local_2370;
      pcVar8 = "result13->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_2350,local_2360,0x267,1,2,&local_2370.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetInputSet((SelectionResult *)pcVar8);
      local_23cc._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)pcVar8);
      local_23cc._vptr_lazy_ostream._0_4_ = 2;
      pcVar10 = "2U";
      plVar6 = &local_23cc;
      pcVar8 = "result13->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_23b0,&local_23cc.field_0xc,0x268,1,2,
                 (undefined1 *)((long)&local_23cc._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    local_23d8 = 100000000;
    CFeeRate::CFeeRate<int>((CFeeRate *)pcVar8,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)pcVar10 & 0xffffffff00000000);
    uVar5 = (ulong)plVar6 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pcVar8 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_23e8 = 200000000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_23f8 = 300000000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_2408 = 400000000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    pcVar10 = (char *)((ulong)puVar9 & 0xffffffff00000000);
    plVar6 = (lazy_ostream *)(uVar5 & 0xffffffff00000000);
    pcVar8 = (char *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_2418 = 95000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2450,local_2470,local_2490,0x270,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_24f0._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_24f0._vptr_lazy_ostream = (_func_int **)0x5f5e100;
      pcVar10 = "1 * COIN";
      plVar6 = &local_24f0;
      pcVar8 = "result14->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_24d0,local_24e0,0x271,1,2,&local_24f0.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetInputSet((SelectionResult *)pcVar8);
      local_254c._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)pcVar8);
      local_254c._vptr_lazy_ostream._0_4_ = 1;
      pcVar10 = "1U";
      plVar6 = &local_254c;
      pcVar8 = "result14->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_2530,&local_254c.field_0xc,0x272,1,2,
                 (undefined1 *)((long)&local_254c._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_2558 = 195000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2590,local_25b0,local_25d0,0x275,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_2630._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_2630._vptr_lazy_ostream = (_func_int **)0xbebc200;
      pcVar10 = "2 * COIN";
      plVar6 = &local_2630;
      pcVar8 = "result15->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_2610,local_2620,0x276,1,2,&local_2630.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetInputSet((SelectionResult *)pcVar8);
      local_268c._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)pcVar8);
      local_268c._vptr_lazy_ostream._0_4_ = 1;
      pcVar10 = "1U";
      plVar6 = &local_268c;
      pcVar8 = "result15->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_2670,&local_268c.field_0xc,0x277,1,2,
                 (undefined1 *)((long)&local_268c._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    CoinsResult::Clear((CoinsResult *)pcVar8);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    local_2698 = 100000;
    CFeeRate::CFeeRate<int>((CFeeRate *)pcVar8,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)pcVar10 & 0xffffffff00000000);
    uVar5 = (ulong)plVar6 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pcVar8 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_26a8 = 200000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_26b8 = 300000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_26c8 = 400000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_26d8 = 500000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    paVar7 = (assertion_result *)((ulong)puVar9 & 0xffffffff00000000);
    plVar6 = (lazy_ostream *)(uVar5 & 0xffffffff00000000);
    pcVar8 = (char *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)paVar7);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)paVar7,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                (paVar7,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2718,local_2738,local_2758,0x285,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_27b0 = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      paVar7 = (assertion_result *)0x1cdecf5;
      plVar6 = (lazy_ostream *)&CENT;
      pcVar8 = "result16->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_2798,local_27a8,0x286,1,2,&local_27b0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)paVar7);
    local_27b8 = 0x423883c0;
    CFeeRate::CFeeRate<int>((CFeeRate *)pcVar8,0);
    paVar7 = (assertion_result *)((ulong)paVar7 & 0xffffffff00000000);
    plVar6 = (lazy_ostream *)((ulong)plVar6 & 0xffffffff00000000);
    pcVar8 = (char *)((ulong)pcVar8 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)paVar7);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_27c8 = 1000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)paVar7,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                (paVar7,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2800,local_2820,local_2840,0x28d,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_28a0._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_28a0._vptr_lazy_ostream = (_func_int **)0xf4240;
      paVar7 = (assertion_result *)0x1cdf734;
      plVar6 = &local_28a0;
      pcVar8 = "result17->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_2880,local_2890,0x28e,1,2,&local_28a0.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)paVar7);
    local_28a8 = 600000;
    CFeeRate::CFeeRate<int>((CFeeRate *)pcVar8,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)paVar7 & 0xffffffff00000000);
    uVar5 = (ulong)plVar6 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pcVar8 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_28b8 = 700000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    pcVar10 = (char *)((ulong)puVar9 & 0xffffffff00000000);
    plVar6 = (lazy_ostream *)(uVar5 & 0xffffffff00000000);
    pcVar8 = (char *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_28c8 = 1000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2900,local_2920,local_2940,0x296,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_29a0._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_29a0._vptr_lazy_ostream = (_func_int **)0xf4240;
      pcVar10 = "1 * CENT";
      plVar6 = &local_29a0;
      pcVar8 = "result18->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_2980,local_2990,0x297,1,2,&local_29a0.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    CoinsResult::Clear((CoinsResult *)pcVar8);
    for (j = 0; j < 0x14; j = j + 1) {
      std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
      local_29a8 = 5000000000000;
      CFeeRate::CFeeRate<int>((CFeeRate *)pcVar8,0);
      pcVar10 = (char *)((ulong)pcVar10 & 0xffffffff00000000);
      plVar6 = (lazy_ostream *)((ulong)plVar6 & 0xffffffff00000000);
      pcVar8 = (char *)((ulong)pcVar8 & 0xffffffff00000000);
      add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
               (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
               in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
               SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    }
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_29b8 = 50000000000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_29f0,local_2a10,local_2a30,0x2a0,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_2a90._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_2a90._vptr_lazy_ostream = (_func_int **)0x2d79883d2000;
      pcVar10 = "500000 * COIN";
      plVar6 = &local_2a90;
      pcVar8 = "result19->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_2a70,local_2a80,0x2a1,1,2,&local_2a90.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetInputSet((SelectionResult *)pcVar8);
      local_2aec._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)pcVar8);
      local_2aec._vptr_lazy_ostream._0_4_ = 10;
      pcVar10 = "10U";
      plVar6 = &local_2aec;
      pcVar8 = "result19->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_2ad0,&local_2aec.field_0xc,0x2a2,1,2,
                 (undefined1 *)((long)&local_2aec._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    CoinsResult::Clear((CoinsResult *)pcVar8);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    local_2af8 = 500000;
    CFeeRate::CFeeRate<int>((CFeeRate *)pcVar8,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)pcVar10 & 0xffffffff00000000);
    uVar5 = (ulong)plVar6 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pcVar8 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_2b08 = 600000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_2b18 = 700000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_2b28 = 0x423883c0;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    pcVar10 = (char *)((ulong)puVar9 & 0xffffffff00000000);
    plVar6 = (lazy_ostream *)(uVar5 & 0xffffffff00000000);
    pcVar8 = (char *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_2b38 = 1000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)pcVar10,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)pcVar10,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2b70,local_2b90,local_2bb0,0x2ae,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_2c10._8_8_ = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_2c10._vptr_lazy_ostream = (_func_int **)0x423883c0;
      pcVar10 = "1111 * CENT";
      plVar6 = &local_2c10;
      pcVar8 = "result20->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_2bf0,local_2c00,0x2af,1,2,&local_2c10.m_empty);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)pcVar10,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetInputSet((SelectionResult *)pcVar8);
      local_2c6c._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)pcVar8);
      local_2c6c._vptr_lazy_ostream._0_4_ = 1;
      pcVar10 = "1U";
      plVar6 = &local_2c6c;
      pcVar8 = "result20->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_2c50,&local_2c6c.field_0xc,0x2b0,1,2,
                 (undefined1 *)((long)&local_2c6c._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
      iVar11 = (int)in_stack_ffffffffffffbed0;
      iVar12 = (int)in_stack_ffffffffffffbee0;
    } while (bVar2);
    CoinsResult::Clear((CoinsResult *)pcVar8);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)pcVar10);
    local_2c78 = 400000;
    CFeeRate::CFeeRate<int>((CFeeRate *)pcVar8,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)pcVar10 & 0xffffffff00000000);
    uVar5 = (ulong)plVar6 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pcVar8 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),iVar11,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),iVar12);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_2c88 = 600000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),iVar11,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),iVar12);
    in_stack_ffffffffffffbee0 =
         std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_2c98 = 800000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),iVar11,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_2ca8 = 0x423883c0;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    paVar7 = (assertion_result *)((ulong)puVar9 & 0xffffffff00000000);
    plVar6 = (lazy_ostream *)(uVar5 & 0xffffffff00000000);
    pcVar8 = (char *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),iVar11,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    in_stack_ffffffffffffbed0 =
         std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                   ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)paVar7);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)paVar7,
               (CAmount *)plVar6,(CAmount)pcVar8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                (paVar7,(optional<wallet::SelectionResult> *)plVar6);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      pcVar8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2ce8,local_2d08,local_2d28,0x2b9,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar8);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      local_2d80 = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      paVar7 = (assertion_result *)0x1cdecf5;
      plVar6 = (lazy_ostream *)&CENT;
      pcVar8 = "result21->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_2d68,local_2d78,0x2ba,1,2,&local_2d80);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)pcVar8);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)pcVar8);
      SelectionResult::GetInputSet((SelectionResult *)pcVar8);
      local_2ddc._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)pcVar8);
      local_2ddc._vptr_lazy_ostream._0_4_ = 2;
      paVar7 = (assertion_result *)0x1c2381d;
      plVar6 = &local_2ddc;
      pcVar8 = "result21->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_2dc0,&local_2ddc.field_0xc,699,1,2,
                 (undefined1 *)((long)&local_2ddc._vptr_lazy_ostream + 4));
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)pcVar8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    CoinsResult::Clear((CoinsResult *)pcVar8);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)paVar7);
    local_2de8 = 50000;
    CFeeRate::CFeeRate<int>((CFeeRate *)pcVar8,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)paVar7 & 0xffffffff00000000);
    uVar5 = (ulong)plVar6 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pcVar8 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_2df8 = 1000000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             ((ulong)puVar9 & 0xffffffff00000000);
    uVar5 = uVar5 & 0xffffffff00000000;
    pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
    local_2e08 = 100000000;
    CFeeRate::CFeeRate<int>(pCVar4,0);
    in_stack_ffffffffffffbb68 = (char *)((ulong)puVar9 & 0xffffffff00000000);
    in_stack_ffffffffffffbb60 = (CoinsResult *)(uVar5 & 0xffffffff00000000);
    in_stack_ffffffffffffbb58 = (char *)((ulong)pCVar4 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
               in_stack_ffffffffffffbb68);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_2e18 = 0x5f60810;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
               in_stack_ffffffffffffbb68,(CAmount *)in_stack_ffffffffffffbb60,
               (CAmount)in_stack_ffffffffffffbb58);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)in_stack_ffffffffffffbb68,
                 (optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb60);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbb60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      in_stack_ffffffffffffbb58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2e50,local_2e70,local_2e90,0x2c5,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbb58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbb60,(char (*) [1])in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      local_2ef0.coins._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_2ef0.coins._M_t._M_impl._0_8_ = 0x605e690;
      in_stack_ffffffffffffbb68 = "CENT * 10105 / 100";
      in_stack_ffffffffffffbb60 = &local_2ef0;
      in_stack_ffffffffffffbb58 = "result22->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                ((_Base_ptr *)
                 ((long)&local_2ef0.coins._M_t._M_impl.super__Rb_tree_header._M_header + 0x18),
                 (_Base_ptr *)
                 ((long)&local_2ef0.coins._M_t._M_impl.super__Rb_tree_header._M_header + 8),0x2c6,1,
                 2,&local_2ef0.coins._M_t._M_impl.super__Rb_tree_header);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbb60,(char (*) [1])in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      SelectionResult::GetInputSet((SelectionResult *)in_stack_ffffffffffffbb58);
      local_2f4c.coins._M_t._M_impl._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)in_stack_ffffffffffffbb58);
      local_2f4c.coins._M_t._M_impl._0_4_ = 3;
      in_stack_ffffffffffffbb68 = "3U";
      in_stack_ffffffffffffbb60 = &local_2f4c;
      in_stack_ffffffffffffbb58 = "result22->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                ((undefined1 *)
                 ((long)&local_2f4c.coins._M_t._M_impl.super__Rb_tree_header._M_header + 0x14),
                 (undefined1 *)
                 ((long)&local_2f4c.coins._M_t._M_impl.super__Rb_tree_header._M_header + 4),0x2c7,1,
                 2,&local_2f4c.coins._M_t._M_impl.field_0x4);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
               in_stack_ffffffffffffbb68);
    KnapsackGroupOutputs
              (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
    local_2f58 = 99900000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
               in_stack_ffffffffffffbb68,(CAmount *)in_stack_ffffffffffffbb60,
               (CAmount)in_stack_ffffffffffffbb58);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)in_stack_ffffffffffffbb68,
                 (optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb60);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbb60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      in_stack_ffffffffffffbb58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2f90,local_2fb0,local_2fd0,0x2cb,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbb58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbb60,(char (*) [1])in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      local_3030.coins._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
      local_3030.coins._M_t._M_impl._0_8_ = 101000000;
      in_stack_ffffffffffffbb68 = "101 * CENT";
      in_stack_ffffffffffffbb60 = &local_3030;
      in_stack_ffffffffffffbb58 = "result23->GetSelectedValue()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                ((_Base_ptr *)
                 ((long)&local_3030.coins._M_t._M_impl.super__Rb_tree_header._M_header + 0x18),
                 (_Base_ptr *)
                 ((long)&local_3030.coins._M_t._M_impl.super__Rb_tree_header._M_header + 8),0x2cc,1,
                 2,&local_3030.coins._M_t._M_impl.super__Rb_tree_header);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbb60,(char (*) [1])in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      std::optional<wallet::SelectionResult>::operator->
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      SelectionResult::GetInputSet((SelectionResult *)in_stack_ffffffffffffbb58);
      local_308c._4_8_ =
           std::
           set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)in_stack_ffffffffffffbb58);
      local_308c._0_4_ = 2;
      in_stack_ffffffffffffbb68 = "2U";
      in_stack_ffffffffffffbb60 = (CoinsResult *)local_308c;
      in_stack_ffffffffffffbb58 = "result23->GetInputSet().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_3070,local_3080,0x2cd,1,2);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
  }
  for (amt = 0x5dc; amt < 100000000; amt = amt * 10) {
    CoinsResult::Clear((CoinsResult *)in_stack_ffffffffffffbb58);
    for (j_1 = 0; j_1 < 0x2a4; j_1 = j_1 + 1) {
      std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
                 in_stack_ffffffffffffbb68);
      CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbb58,0);
      in_stack_ffffffffffffbb68 = (char *)((ulong)in_stack_ffffffffffffbb68 & 0xffffffff00000000);
      in_stack_ffffffffffffbb60 =
           (CoinsResult *)((ulong)in_stack_ffffffffffffbb60 & 0xffffffff00000000);
      in_stack_ffffffffffffbb58 = (char *)((ulong)in_stack_ffffffffffffbb58 & 0xffffffff00000000);
      add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
               (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
               in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
               SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
    }
    for (i_1 = 0; i_1 < 100; i_1 = i_1 + 1) {
      std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
                ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
                 in_stack_ffffffffffffbb68);
      KnapsackGroupOutputs
                (in_stack_ffffffffffffbbe0,in_stack_ffffffffffffbbd8,in_stack_ffffffffffffbbd0);
      local_30a8 = 2000;
      test_method::anon_class_8_1_8990f923::operator()
                (in_stack_ffffffffffffbb70,
                 (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                 in_stack_ffffffffffffbb68,(CAmount *)in_stack_ffffffffffffbb60,
                 (CAmount)in_stack_ffffffffffffbb58);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                   (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                   (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
        boost::test_tools::assertion_result::
        assertion_result<std::optional<wallet::SelectionResult>>
                  ((assertion_result *)in_stack_ffffffffffffbb68,
                   (optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb60);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                   (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbb60,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                   (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
        in_stack_ffffffffffffbb58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_30e0,local_3100,local_3120,0x2da,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffbb58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbb58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      if (amt + -2000 < 1000000) {
        dVar3 = ceil(1002000.0 / (double)amt);
        returnSize = (uint16_t)(int)dVar3;
        returnValue = amt * (ulong)returnSize;
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                     (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                     (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbb60,
                     (char (*) [1])in_stack_ffffffffffffbb58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                     (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
          std::optional<wallet::SelectionResult>::operator->
                    ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
          local_3188 = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
          in_stack_ffffffffffffbb68 = "returnValue";
          in_stack_ffffffffffffbb60 = (CoinsResult *)&returnValue;
          in_stack_ffffffffffffbb58 = "result24->GetSelectedValue()";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                    (local_3170,local_3180,0x2e0,1,2,&local_3188);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbb58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                     (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                     (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbb60,
                     (char (*) [1])in_stack_ffffffffffffbb58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                     (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
          std::optional<wallet::SelectionResult>::operator->
                    ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
          SelectionResult::GetInputSet((SelectionResult *)in_stack_ffffffffffffbb58);
          local_31e0 = std::
                       set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                       ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                               *)in_stack_ffffffffffffbb58);
          in_stack_ffffffffffffbb68 = "returnSize";
          in_stack_ffffffffffffbb60 = (CoinsResult *)&returnSize;
          in_stack_ffffffffffffbb58 = "result24->GetInputSet().size()";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_short>
                    (local_31c8,local_31d8,0x2e1,1,2);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbb58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
      }
      else {
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                     (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                     (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbb60,
                     (char (*) [1])in_stack_ffffffffffffbb58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                     (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
          std::optional<wallet::SelectionResult>::operator->
                    ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
          local_3238 = SelectionResult::GetSelectedValue(in_stack_ffffffffffffbb78);
          in_stack_ffffffffffffbb68 = "amt";
          in_stack_ffffffffffffbb60 = (CoinsResult *)&amt;
          in_stack_ffffffffffffbb58 = "result24->GetSelectedValue()";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                    (local_3220,local_3230,0x2e4,1,2,&local_3238);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbb58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                     (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                     (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                     (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_ffffffffffffbb60,
                     (char (*) [1])in_stack_ffffffffffffbb58);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                     (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
          std::optional<wallet::SelectionResult>::operator->
                    ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
          in_stack_ffffffffffffbce0.nSatoshisPerK =
               (CAmount)SelectionResult::GetInputSet((SelectionResult *)in_stack_ffffffffffffbb58);
          local_3294.coins._M_t._M_impl._4_8_ =
               std::
               set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               ::size((set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                       *)in_stack_ffffffffffffbb58);
          local_3294.coins._M_t._M_impl._0_4_ = 1;
          in_stack_ffffffffffffbb68 = "1U";
          in_stack_ffffffffffffbb60 = &local_3294;
          in_stack_ffffffffffffbb58 = "result24->GetInputSet().size()";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                    ((undefined1 *)
                     ((long)&local_3294.coins._M_t._M_impl.super__Rb_tree_header._M_header + 0x14),
                     (undefined1 *)
                     ((long)&local_3294.coins._M_t._M_impl.super__Rb_tree_header._M_header + 4),
                     0x2e5,1,2);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_ffffffffffffbb58);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
      }
      std::optional<wallet::SelectionResult>::~optional
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    }
  }
  CoinsResult::Clear((CoinsResult *)in_stack_ffffffffffffbb58);
  for (i2 = 0; i2 < 100; i2 = i2 + 1) {
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
               in_stack_ffffffffffffbb68);
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbb58,0);
    in_stack_ffffffffffffbb68 = (char *)((ulong)in_stack_ffffffffffffbb68 & 0xffffffff00000000);
    in_stack_ffffffffffffbb60 =
         (CoinsResult *)((ulong)in_stack_ffffffffffffbb60 & 0xffffffff00000000);
    in_stack_ffffffffffffbb58 = (char *)((ulong)in_stack_ffffffffffffbb58 & 0xffffffff00000000);
    add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
             (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
             in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),(int)in_stack_ffffffffffffbed0,
             SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),(int)in_stack_ffffffffffffbee0);
  }
  i_2 = 0;
  while( true ) {
    iVar12 = (int)in_stack_ffffffffffffbee0;
    iVar11 = (int)in_stack_ffffffffffffbed0;
    if (99 < i_2) break;
    CoinsResult::All((CoinsResult *)CONCAT17(in_stack_ffffffffffffbbc7,in_stack_ffffffffffffbbc0));
    GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
               in_stack_ffffffffffffbba8,(bool)in_stack_ffffffffffffbba7);
    local_32c0 = 5000000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
               in_stack_ffffffffffffbb68,(CAmount *)in_stack_ffffffffffffbb60,
               (CAmount)in_stack_ffffffffffffbb58);
    std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
               in_stack_ffffffffffffbb68);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)in_stack_ffffffffffffbb68,
                 (optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb60);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbb60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      in_stack_ffffffffffffbb58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_32f8,local_3318,local_3338,0x2f5,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbb58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    CoinsResult::All((CoinsResult *)CONCAT17(in_stack_ffffffffffffbbc7,in_stack_ffffffffffffbbc0));
    GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
               in_stack_ffffffffffffbba8,(bool)in_stack_ffffffffffffbba7);
    local_3358 = 5000000000;
    test_method::anon_class_8_1_8990f923::operator()
              (in_stack_ffffffffffffbb70,
               (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
               in_stack_ffffffffffffbb68,(CAmount *)in_stack_ffffffffffffbb60,
               (CAmount)in_stack_ffffffffffffbb58);
    std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
               in_stack_ffffffffffffbb68);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::test_tools::assertion_result::assertion_result<std::optional<wallet::SelectionResult>>
                ((assertion_result *)in_stack_ffffffffffffbb68,
                 (optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb60);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbb60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      in_stack_ffffffffffffbb58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3390,local_33b0,local_33d0,0x2f7,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbb58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      std::optional<wallet::SelectionResult>::operator*
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      std::optional<wallet::SelectionResult>::operator*
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      EqualResult(in_stack_ffffffffffffbb98,in_stack_ffffffffffffbb90);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffbb68,
                 SUB81((ulong)in_stack_ffffffffffffbb60 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbb60,
                 (basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      in_stack_ffffffffffffbb58 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_3408,local_3428,local_3448,0x2f8,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffbb58);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    fails = 0;
    for (j_2 = 0; j_2 < 5; j_2 = j_2 + 1) {
      CoinsResult::All((CoinsResult *)CONCAT17(in_stack_ffffffffffffbbc7,in_stack_ffffffffffffbbc0))
      ;
      GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
                 in_stack_ffffffffffffbba8,(bool)in_stack_ffffffffffffbba7);
      test_method::anon_class_8_1_8990f923::operator()
                (in_stack_ffffffffffffbb70,
                 (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                 in_stack_ffffffffffffbb68,(CAmount *)in_stack_ffffffffffffbb60,
                 (CAmount)in_stack_ffffffffffffbb58);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
                 in_stack_ffffffffffffbb68);
      do {
        in_stack_ffffffffffffbc58 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                   (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                   (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
        boost::test_tools::assertion_result::
        assertion_result<std::optional<wallet::SelectionResult>>
                  ((assertion_result *)in_stack_ffffffffffffbb68,
                   (optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb60);
        in_stack_ffffffffffffbc50 = (CWallet *)boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                   (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbb60,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                   (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
        in_stack_ffffffffffffbb58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_34a0,local_34c0,local_34e0,0x302,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffbb58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbb58);
        in_stack_ffffffffffffbc4f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_ffffffffffffbc4f);
      CoinsResult::All((CoinsResult *)CONCAT17(in_stack_ffffffffffffbbc7,in_stack_ffffffffffffbbc0))
      ;
      in_stack_ffffffffffffbc40 =
           GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
                      in_stack_ffffffffffffbba8,(bool)in_stack_ffffffffffffbba7);
      test_method::anon_class_8_1_8990f923::operator()
                (in_stack_ffffffffffffbb70,
                 (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                 in_stack_ffffffffffffbb68,(CAmount *)in_stack_ffffffffffffbb60,
                 (CAmount)in_stack_ffffffffffffbb58);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
                 in_stack_ffffffffffffbb68);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                   (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                   (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
        boost::test_tools::assertion_result::
        assertion_result<std::optional<wallet::SelectionResult>>
                  ((assertion_result *)in_stack_ffffffffffffbb68,
                   (optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb60);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                   (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_ffffffffffffbb60,
                   (basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                   (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
        in_stack_ffffffffffffbb58 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_3530,local_3550,local_3570,0x304,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffbb58);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffbb58);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      std::optional<wallet::SelectionResult>::operator*
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      std::optional<wallet::SelectionResult>::operator*
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      bVar2 = EqualResult(in_stack_ffffffffffffbb98,in_stack_ffffffffffffbb90);
      if (bVar2) {
        fails = fails + 1;
      }
      std::optional<wallet::SelectionResult>::~optional
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
      std::optional<wallet::SelectionResult>::~optional
                ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb58);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffbb60,(char (*) [1])in_stack_ffffffffffffbb58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffbb68,
                 (pointer)in_stack_ffffffffffffbb60,(unsigned_long)in_stack_ffffffffffffbb58);
      local_35c4.coins._M_t._M_impl._0_4_ = 5;
      in_stack_ffffffffffffbb68 = "5";
      in_stack_ffffffffffffbb60 = &local_35c4;
      in_stack_ffffffffffffbb58 = "fails";
      boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,int,int>
                ((undefined1 *)
                 ((long)&local_35c4.coins._M_t._M_impl.super__Rb_tree_header._M_header + 0xc),
                 &local_35c4.coins._M_t._M_impl.field_0x4,0x308,1,3);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffbb58);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    std::optional<wallet::SelectionResult>::~optional
              ((optional<wallet::SelectionResult> *)in_stack_ffffffffffffbb58);
    i_2 = i_2 + 1;
  }
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_ffffffffffffbb68);
  local_35d0 = std::__atomic_base<unsigned_long>::operator=;
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_ffffffffffffbb58,0);
  puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
           ((ulong)in_stack_ffffffffffffbb68 & 0xffffffff00000000);
  uVar5 = (ulong)in_stack_ffffffffffffbb60 & 0xffffffff00000000;
  pCVar4 = (CFeeRate *)((ulong)in_stack_ffffffffffffbb58 & 0xffffffff00000000);
  add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
           (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
           in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
           SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),iVar11,
           SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),iVar12);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
  local_35e0 = 10000000;
  CFeeRate::CFeeRate<int>(pCVar4,0);
  puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
           ((ulong)puVar9 & 0xffffffff00000000);
  uVar5 = uVar5 & 0xffffffff00000000;
  pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
  add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
           (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
           in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
           SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),iVar11,
           SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),iVar12);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
  local_35f0 = 15000000;
  CFeeRate::CFeeRate<int>(pCVar4,0);
  puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
           ((ulong)puVar9 & 0xffffffff00000000);
  uVar5 = uVar5 & 0xffffffff00000000;
  pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
  add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
           (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
           in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
           SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),iVar11,
           SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),iVar12);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
  local_3600 = 20000000;
  CFeeRate::CFeeRate<int>(pCVar4,0);
  puVar9 = (unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
           ((ulong)puVar9 & 0xffffffff00000000);
  uVar5 = uVar5 & 0xffffffff00000000;
  pCVar4 = (CFeeRate *)((ulong)pCVar4 & 0xffffffff00000000);
  add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
           (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
           in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
           SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),iVar11,
           SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),iVar12);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*(puVar9);
  local_3610 = 25000000;
  CFeeRate::CFeeRate<int>(pCVar4,0);
  paVar7 = (assertion_result *)((ulong)puVar9 & 0xffffffff00000000);
  plVar6 = (lazy_ostream *)(uVar5 & 0xffffffff00000000);
  this_00 = (FastRandomContext *)((ulong)pCVar4 & 0xffffffff00000000);
  add_coin((CoinsResult *)in_stack_ffffffffffffbc58,in_stack_ffffffffffffbc50,
           (CAmount *)CONCAT17(in_stack_ffffffffffffbc4f,in_stack_ffffffffffffbc48),
           in_stack_ffffffffffffbce0,(int)((ulong)in_stack_ffffffffffffbc40 >> 0x20),
           SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x18,0),iVar11,
           SUB81((ulong)in_stack_ffffffffffffbc40 >> 0x10,0),iVar12);
  for (i_3 = 0; i_3 < 100; i_3 = i_3 + 1) {
    fails_1 = 0;
    for (j_3 = 0; j_3 < 5; j_3 = j_3 + 1) {
      CoinsResult::All((CoinsResult *)CONCAT17(in_stack_ffffffffffffbbc7,in_stack_ffffffffffffbbc0))
      ;
      GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
                 in_stack_ffffffffffffbba8,(bool)in_stack_ffffffffffffbba7);
      local_3640 = 90000000;
      test_method::anon_class_8_1_8990f923::operator()
                (in_stack_ffffffffffffbb70,
                 (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)paVar7,
                 (CAmount *)plVar6,(CAmount)this_00);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)paVar7);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)this_00);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)this_00);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                   (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
        boost::test_tools::assertion_result::
        assertion_result<std::optional<wallet::SelectionResult>>
                  (paVar7,(optional<wallet::SelectionResult> *)plVar6);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)this_00);
        boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)this_00);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)this_00);
        this_00 = (FastRandomContext *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_3678,local_3698,local_36b8,0x319,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)this_00);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
        in_stack_ffffffffffffbbc7 = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_ffffffffffffbbc7);
      CoinsResult::All((CoinsResult *)CONCAT17(in_stack_ffffffffffffbbc7,in_stack_ffffffffffffbbc0))
      ;
      GroupCoins((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
                 in_stack_ffffffffffffbba8,(bool)in_stack_ffffffffffffbba7);
      local_36d8 = 90000000;
      test_method::anon_class_8_1_8990f923::operator()
                (in_stack_ffffffffffffbb70,
                 (vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)paVar7,
                 (CAmount *)plVar6,(CAmount)this_00);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)paVar7);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)this_00);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)this_00);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                   (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                   (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
        boost::test_tools::assertion_result::
        assertion_result<std::optional<wallet::SelectionResult>>
                  (paVar7,(optional<wallet::SelectionResult> *)plVar6);
        in_stack_ffffffffffffbba8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)this_00);
        boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)this_00);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)this_00);
        this_00 = (FastRandomContext *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_3710,local_3730,local_3750,0x31b,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)this_00);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
        in_stack_ffffffffffffbba7 = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_ffffffffffffbba7);
      in_stack_ffffffffffffbb98 =
           std::optional<wallet::SelectionResult>::operator*
                     ((optional<wallet::SelectionResult> *)this_00);
      std::optional<wallet::SelectionResult>::operator*
                ((optional<wallet::SelectionResult> *)this_00);
      bVar2 = EqualResult(in_stack_ffffffffffffbb98,in_stack_ffffffffffffbb90);
      if (bVar2) {
        fails_1 = fails_1 + 1;
      }
      std::optional<wallet::SelectionResult>::~optional
                ((optional<wallet::SelectionResult> *)this_00);
      std::optional<wallet::SelectionResult>::~optional
                ((optional<wallet::SelectionResult> *)this_00);
    }
    do {
      in_stack_ffffffffffffbb90 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffbb98,
                 (const_string *)in_stack_ffffffffffffbb90,(size_t)in_stack_ffffffffffffbb88,
                 (const_string *)CONCAT17(in_stack_ffffffffffffbb87,in_stack_ffffffffffffbb80));
      in_stack_ffffffffffffbb88 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(plVar6,(char (*) [1])this_00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)paVar7,(pointer)plVar6,(unsigned_long)this_00);
      local_37a4._vptr_lazy_ostream._0_4_ = 5;
      paVar7 = (assertion_result *)0x1bfe8cb;
      plVar6 = &local_37a4;
      this_00 = (FastRandomContext *)0x1bc94e6;
      boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,int,int>
                (local_3790,(undefined1 *)((long)&local_37a4._vptr_lazy_ostream + 4),799,1,3,
                 &fails_1);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)this_00);
      in_stack_ffffffffffffbb87 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_ffffffffffffbb87);
  }
  CoinsResult::~CoinsResult((CoinsResult *)this_00);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)paVar7);
  FastRandomContext::~FastRandomContext(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(knapsack_solver_test)
{
    FastRandomContext rand{};
    const auto temp1{[&rand](std::vector<OutputGroup>& g, const CAmount& v, CAmount c) { return KnapsackSolver(g, v, c, rand); }};
    const auto KnapsackSolver{temp1};
    std::unique_ptr<CWallet> wallet = NewWallet(m_node);

    CoinsResult available_coins;

    // test multiple times to allow for differences in the shuffle order
    for (int i = 0; i < RUN_TESTS; i++)
    {
        available_coins.Clear();

        // with an empty wallet we can't even pay one cent
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 1 * CENT, CENT));

        add_coin(available_coins, *wallet, 1*CENT, CFeeRate(0), 4);        // add a new 1 cent coin

        // with a new 1 cent coin, we still can't find a mature 1 cent
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 1 * CENT, CENT));

        // but we can find a new 1 cent
        const auto result1 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 1 * CENT, CENT);
        BOOST_CHECK(result1);
        BOOST_CHECK_EQUAL(result1->GetSelectedValue(), 1 * CENT);

        add_coin(available_coins, *wallet, 2*CENT);           // add a mature 2 cent coin

        // we can't make 3 cents of mature coins
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 3 * CENT, CENT));

        // we can make 3 cents of new coins
        const auto result2 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 3 * CENT, CENT);
        BOOST_CHECK(result2);
        BOOST_CHECK_EQUAL(result2->GetSelectedValue(), 3 * CENT);

        add_coin(available_coins, *wallet, 5*CENT);           // add a mature 5 cent coin,
        add_coin(available_coins, *wallet, 10*CENT, CFeeRate(0), 3, true); // a new 10 cent coin sent from one of our own addresses
        add_coin(available_coins, *wallet, 20*CENT);          // and a mature 20 cent coin

        // now we have new: 1+10=11 (of which 10 was self-sent), and mature: 2+5+20=27.  total = 38

        // we can't make 38 cents only if we disallow new coins:
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 38 * CENT, CENT));
        // we can't even make 37 cents if we don't allow new coins even if they're from us
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard_extra), 38 * CENT, CENT));
        // but we can make 37 cents if we accept new coins from ourself
        const auto result3 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_standard), 37 * CENT, CENT);
        BOOST_CHECK(result3);
        BOOST_CHECK_EQUAL(result3->GetSelectedValue(), 37 * CENT);
        // and we can make 38 cents if we accept all new coins
        const auto result4 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 38 * CENT, CENT);
        BOOST_CHECK(result4);
        BOOST_CHECK_EQUAL(result4->GetSelectedValue(), 38 * CENT);

        // try making 34 cents from 1,2,5,10,20 - we can't do it exactly
        const auto result5 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 34 * CENT, CENT);
        BOOST_CHECK(result5);
        BOOST_CHECK_EQUAL(result5->GetSelectedValue(), 35 * CENT);       // but 35 cents is closest
        BOOST_CHECK_EQUAL(result5->GetInputSet().size(), 3U);     // the best should be 20+10+5.  it's incredibly unlikely the 1 or 2 got included (but possible)

        // when we try making 7 cents, the smaller coins (1,2,5) are enough.  We should see just 2+5
        const auto result6 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 7 * CENT, CENT);
        BOOST_CHECK(result6);
        BOOST_CHECK_EQUAL(result6->GetSelectedValue(), 7 * CENT);
        BOOST_CHECK_EQUAL(result6->GetInputSet().size(), 2U);

        // when we try making 8 cents, the smaller coins (1,2,5) are exactly enough.
        const auto result7 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 8 * CENT, CENT);
        BOOST_CHECK(result7);
        BOOST_CHECK(result7->GetSelectedValue() == 8 * CENT);
        BOOST_CHECK_EQUAL(result7->GetInputSet().size(), 3U);

        // when we try making 9 cents, no subset of smaller coins is enough, and we get the next bigger coin (10)
        const auto result8 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 9 * CENT, CENT);
        BOOST_CHECK(result8);
        BOOST_CHECK_EQUAL(result8->GetSelectedValue(), 10 * CENT);
        BOOST_CHECK_EQUAL(result8->GetInputSet().size(), 1U);

        // now clear out the wallet and start again to test choosing between subsets of smaller coins and the next biggest coin
        available_coins.Clear();

        add_coin(available_coins, *wallet,  6*CENT);
        add_coin(available_coins, *wallet,  7*CENT);
        add_coin(available_coins, *wallet,  8*CENT);
        add_coin(available_coins, *wallet, 20*CENT);
        add_coin(available_coins, *wallet, 30*CENT); // now we have 6+7+8+20+30 = 71 cents total

        // check that we have 71 and not 72
        const auto result9 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 71 * CENT, CENT);
        BOOST_CHECK(result9);
        BOOST_CHECK(!KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 72 * CENT, CENT));

        // now try making 16 cents.  the best smaller coins can do is 6+7+8 = 21; not as good at the next biggest coin, 20
        const auto result10 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 16 * CENT, CENT);
        BOOST_CHECK(result10);
        BOOST_CHECK_EQUAL(result10->GetSelectedValue(), 20 * CENT); // we should get 20 in one coin
        BOOST_CHECK_EQUAL(result10->GetInputSet().size(), 1U);

        add_coin(available_coins, *wallet,  5*CENT); // now we have 5+6+7+8+20+30 = 75 cents total

        // now if we try making 16 cents again, the smaller coins can make 5+6+7 = 18 cents, better than the next biggest coin, 20
        const auto result11 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 16 * CENT, CENT);
        BOOST_CHECK(result11);
        BOOST_CHECK_EQUAL(result11->GetSelectedValue(), 18 * CENT); // we should get 18 in 3 coins
        BOOST_CHECK_EQUAL(result11->GetInputSet().size(), 3U);

        add_coin(available_coins, *wallet,  18*CENT); // now we have 5+6+7+8+18+20+30

        // and now if we try making 16 cents again, the smaller coins can make 5+6+7 = 18 cents, the same as the next biggest coin, 18
        const auto result12 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 16 * CENT, CENT);
        BOOST_CHECK(result12);
        BOOST_CHECK_EQUAL(result12->GetSelectedValue(), 18 * CENT);  // we should get 18 in 1 coin
        BOOST_CHECK_EQUAL(result12->GetInputSet().size(), 1U); // because in the event of a tie, the biggest coin wins

        // now try making 11 cents.  we should get 5+6
        const auto result13 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 11 * CENT, CENT);
        BOOST_CHECK(result13);
        BOOST_CHECK_EQUAL(result13->GetSelectedValue(), 11 * CENT);
        BOOST_CHECK_EQUAL(result13->GetInputSet().size(), 2U);

        // check that the smallest bigger coin is used
        add_coin(available_coins, *wallet,  1*COIN);
        add_coin(available_coins, *wallet,  2*COIN);
        add_coin(available_coins, *wallet,  3*COIN);
        add_coin(available_coins, *wallet,  4*COIN); // now we have 5+6+7+8+18+20+30+100+200+300+400 = 1094 cents
        const auto result14 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 95 * CENT, CENT);
        BOOST_CHECK(result14);
        BOOST_CHECK_EQUAL(result14->GetSelectedValue(), 1 * COIN);  // we should get 1 BTC in 1 coin
        BOOST_CHECK_EQUAL(result14->GetInputSet().size(), 1U);

        const auto result15 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 195 * CENT, CENT);
        BOOST_CHECK(result15);
        BOOST_CHECK_EQUAL(result15->GetSelectedValue(), 2 * COIN);  // we should get 2 BTC in 1 coin
        BOOST_CHECK_EQUAL(result15->GetInputSet().size(), 1U);

        // empty the wallet and start again, now with fractions of a cent, to test small change avoidance

        available_coins.Clear();
        add_coin(available_coins, *wallet, CENT * 1 / 10);
        add_coin(available_coins, *wallet, CENT * 2 / 10);
        add_coin(available_coins, *wallet, CENT * 3 / 10);
        add_coin(available_coins, *wallet, CENT * 4 / 10);
        add_coin(available_coins, *wallet, CENT * 5 / 10);

        // try making 1 * CENT from the 1.5 * CENT
        // we'll get change smaller than CENT whatever happens, so can expect CENT exactly
        const auto result16 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), CENT, CENT);
        BOOST_CHECK(result16);
        BOOST_CHECK_EQUAL(result16->GetSelectedValue(), CENT);

        // but if we add a bigger coin, small change is avoided
        add_coin(available_coins, *wallet, 1111*CENT);

        // try making 1 from 0.1 + 0.2 + 0.3 + 0.4 + 0.5 + 1111 = 1112.5
        const auto result17 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 1 * CENT, CENT);
        BOOST_CHECK(result17);
        BOOST_CHECK_EQUAL(result17->GetSelectedValue(), 1 * CENT); // we should get the exact amount

        // if we add more small coins:
        add_coin(available_coins, *wallet, CENT * 6 / 10);
        add_coin(available_coins, *wallet, CENT * 7 / 10);

        // and try again to make 1.0 * CENT
        const auto result18 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 1 * CENT, CENT);
        BOOST_CHECK(result18);
        BOOST_CHECK_EQUAL(result18->GetSelectedValue(), 1 * CENT); // we should get the exact amount

        // run the 'mtgox' test (see https://blockexplorer.com/tx/29a3efd3ef04f9153d47a990bd7b048a4b2d213daaa5fb8ed670fb85f13bdbcf)
        // they tried to consolidate 10 50k coins into one 500k coin, and ended up with 50k in change
        available_coins.Clear();
        for (int j = 0; j < 20; j++)
            add_coin(available_coins, *wallet, 50000 * COIN);

        const auto result19 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 500000 * COIN, CENT);
        BOOST_CHECK(result19);
        BOOST_CHECK_EQUAL(result19->GetSelectedValue(), 500000 * COIN); // we should get the exact amount
        BOOST_CHECK_EQUAL(result19->GetInputSet().size(), 10U); // in ten coins

        // if there's not enough in the smaller coins to make at least 1 * CENT change (0.5+0.6+0.7 < 1.0+1.0),
        // we need to try finding an exact subset anyway

        // sometimes it will fail, and so we use the next biggest coin:
        available_coins.Clear();
        add_coin(available_coins, *wallet, CENT * 5 / 10);
        add_coin(available_coins, *wallet, CENT * 6 / 10);
        add_coin(available_coins, *wallet, CENT * 7 / 10);
        add_coin(available_coins, *wallet, 1111 * CENT);
        const auto result20 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 1 * CENT, CENT);
        BOOST_CHECK(result20);
        BOOST_CHECK_EQUAL(result20->GetSelectedValue(), 1111 * CENT); // we get the bigger coin
        BOOST_CHECK_EQUAL(result20->GetInputSet().size(), 1U);

        // but sometimes it's possible, and we use an exact subset (0.4 + 0.6 = 1.0)
        available_coins.Clear();
        add_coin(available_coins, *wallet, CENT * 4 / 10);
        add_coin(available_coins, *wallet, CENT * 6 / 10);
        add_coin(available_coins, *wallet, CENT * 8 / 10);
        add_coin(available_coins, *wallet, 1111 * CENT);
        const auto result21 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), CENT, CENT);
        BOOST_CHECK(result21);
        BOOST_CHECK_EQUAL(result21->GetSelectedValue(), CENT);   // we should get the exact amount
        BOOST_CHECK_EQUAL(result21->GetInputSet().size(), 2U); // in two coins 0.4+0.6

        // test avoiding small change
        available_coins.Clear();
        add_coin(available_coins, *wallet, CENT * 5 / 100);
        add_coin(available_coins, *wallet, CENT * 1);
        add_coin(available_coins, *wallet, CENT * 100);

        // trying to make 100.01 from these three coins
        const auto result22 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), CENT * 10001 / 100, CENT);
        BOOST_CHECK(result22);
        BOOST_CHECK_EQUAL(result22->GetSelectedValue(), CENT * 10105 / 100); // we should get all coins
        BOOST_CHECK_EQUAL(result22->GetInputSet().size(), 3U);

        // but if we try to make 99.9, we should take the bigger of the two small coins to avoid small change
        const auto result23 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), CENT * 9990 / 100, CENT);
        BOOST_CHECK(result23);
        BOOST_CHECK_EQUAL(result23->GetSelectedValue(), 101 * CENT);
        BOOST_CHECK_EQUAL(result23->GetInputSet().size(), 2U);
    }

    // test with many inputs
    for (CAmount amt=1500; amt < COIN; amt*=10) {
        available_coins.Clear();
        // Create 676 inputs (=  (old MAX_STANDARD_TX_SIZE == 100000)  / 148 bytes per input)
        for (uint16_t j = 0; j < 676; j++)
            add_coin(available_coins, *wallet, amt);

        // We only create the wallet once to save time, but we still run the coin selection RUN_TESTS times.
        for (int i = 0; i < RUN_TESTS; i++) {
            const auto result24 = KnapsackSolver(KnapsackGroupOutputs(available_coins, *wallet, filter_confirmed), 2000, CENT);
            BOOST_CHECK(result24);

            if (amt - 2000 < CENT) {
                // needs more than one input:
                uint16_t returnSize = std::ceil((2000.0 + CENT)/amt);
                CAmount returnValue = amt * returnSize;
                BOOST_CHECK_EQUAL(result24->GetSelectedValue(), returnValue);
                BOOST_CHECK_EQUAL(result24->GetInputSet().size(), returnSize);
            } else {
                // one input is sufficient:
                BOOST_CHECK_EQUAL(result24->GetSelectedValue(), amt);
                BOOST_CHECK_EQUAL(result24->GetInputSet().size(), 1U);
            }
        }
    }

    // test randomness
    {
        available_coins.Clear();
        for (int i2 = 0; i2 < 100; i2++)
            add_coin(available_coins, *wallet, COIN);

        // Again, we only create the wallet once to save time, but we still run the coin selection RUN_TESTS times.
        for (int i = 0; i < RUN_TESTS; i++) {
            // picking 50 from 100 coins doesn't depend on the shuffle,
            // but does depend on randomness in the stochastic approximation code
            const auto result25 = KnapsackSolver(GroupCoins(available_coins.All()), 50 * COIN, CENT);
            BOOST_CHECK(result25);
            const auto result26 = KnapsackSolver(GroupCoins(available_coins.All()), 50 * COIN, CENT);
            BOOST_CHECK(result26);
            BOOST_CHECK(!EqualResult(*result25, *result26));

            int fails = 0;
            for (int j = 0; j < RANDOM_REPEATS; j++)
            {
                // Test that the KnapsackSolver selects randomly from equivalent coins (same value and same input size).
                // When choosing 1 from 100 identical coins, 1% of the time, this test will choose the same coin twice
                // which will cause it to fail.
                // To avoid that issue, run the test RANDOM_REPEATS times and only complain if all of them fail
                const auto result27 = KnapsackSolver(GroupCoins(available_coins.All()), COIN, CENT);
                BOOST_CHECK(result27);
                const auto result28 = KnapsackSolver(GroupCoins(available_coins.All()), COIN, CENT);
                BOOST_CHECK(result28);
                if (EqualResult(*result27, *result28))
                    fails++;
            }
            BOOST_CHECK_NE(fails, RANDOM_REPEATS);
        }

        // add 75 cents in small change.  not enough to make 90 cents,
        // then try making 90 cents.  there are multiple competing "smallest bigger" coins,
        // one of which should be picked at random
        add_coin(available_coins, *wallet, 5 * CENT);
        add_coin(available_coins, *wallet, 10 * CENT);
        add_coin(available_coins, *wallet, 15 * CENT);
        add_coin(available_coins, *wallet, 20 * CENT);
        add_coin(available_coins, *wallet, 25 * CENT);

        for (int i = 0; i < RUN_TESTS; i++) {
            int fails = 0;
            for (int j = 0; j < RANDOM_REPEATS; j++)
            {
                const auto result29 = KnapsackSolver(GroupCoins(available_coins.All()), 90 * CENT, CENT);
                BOOST_CHECK(result29);
                const auto result30 = KnapsackSolver(GroupCoins(available_coins.All()), 90 * CENT, CENT);
                BOOST_CHECK(result30);
                if (EqualResult(*result29, *result30))
                    fails++;
            }
            BOOST_CHECK_NE(fails, RANDOM_REPEATS);
        }
    }
}